

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const(&)[10],char_const*const&,char_const(&)[3],int_const&,char_const(&)[3],kj::String_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],char **params_1,
          char (*params_2) [3],int *params_3,char (*params_4) [3],String *params_5)

{
  char (*value) [10];
  char **value_00;
  char (*pacVar1) [3];
  kj *this_00;
  String *value_01;
  int *value_02;
  String *params_5_00;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_14UL> local_80;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [3];
  char (*params_local_4) [3];
  int *params_local_3;
  char (*params_local_2) [3];
  char **params_local_1;
  char (*params_local) [10];
  
  params_5_00 = __return_storage_ptr__;
  local_38 = (char (*) [3])params_3;
  params_local_4 = params_2;
  params_local_3 = (int *)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (char **)this;
  params_local = (char (*) [10])__return_storage_ptr__;
  value = ::const((char (*) [10])this);
  local_48 = toCharSequence<char_const(&)[10]>(value);
  value_00 = fwd<char_const*const&>((char **)params_local_2);
  local_58 = toCharSequence<char_const*const&>(value_00);
  pacVar1 = ::const((char (*) [3])params_local_3);
  local_68 = toCharSequence<char_const(&)[3]>(pacVar1);
  this_00 = (kj *)fwd<int_const&>((int *)params_local_4);
  toCharSequence<int_const&>(&local_80,this_00,value_02);
  pacVar1 = ::const(local_38);
  local_90 = toCharSequence<char_const(&)[3]>(pacVar1);
  value_01 = fwd<kj::String_const&>((String *)params_4);
  local_a0 = toCharSequence<kj::String_const&>(value_01);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_5_00,(_ *)&local_48,&local_58,&local_68,(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_14UL> *)&local_90,&local_a0,(ArrayPtr<const_char> *)params_5_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}